

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O1

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  long lVar2;
  QArrayData *pQVar3;
  QArrayData *pQVar4;
  Data *pDVar5;
  XmlOutput *pXVar6;
  undefined4 in_register_00000034;
  storage_type *psVar7;
  long in_FS_OFFSET;
  QArrayData *pQVar8;
  QArrayData *pQVar9;
  QArrayData *pQVar10;
  QArrayData *pQVar11;
  QArrayData *pQVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  xml_output local_8d0;
  undefined1 local_898 [16];
  Data *local_888;
  undefined1 auStack_880 [16];
  undefined1 auStack_870 [16];
  xml_output local_860;
  xml_output local_828;
  xml_output local_7f0;
  undefined1 local_7b8 [16];
  Data *pDStack_7a8;
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  Data *pDStack_770;
  undefined1 local_768 [16];
  undefined1 local_758 [16];
  undefined1 local_748 [16];
  Data *local_738;
  undefined1 auStack_730 [16];
  undefined1 auStack_720 [24];
  xml_output local_708;
  xml_output local_6d0;
  undefined1 local_698 [16];
  Data *local_688;
  undefined1 auStack_680 [16];
  undefined1 auStack_670 [16];
  undefined1 local_660 [16];
  Data *pDStack_650;
  undefined1 local_648 [16];
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  Data *pDStack_618;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  Data *pDStack_5e0;
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [16];
  xml_output local_5b8;
  undefined1 local_580 [16];
  Data *pDStack_570;
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  xml_output local_548;
  undefined1 local_510 [16];
  Data *pDStack_500;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  Data *pDStack_4c8;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  xml_output local_4a0;
  undefined1 local_468 [16];
  Data *pDStack_458;
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  xml_output local_430;
  xml_output local_3f8;
  undefined1 local_3c0 [16];
  Data *pDStack_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  Data *pDStack_378;
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  xml_output local_350;
  xml_output local_318;
  xml_output local_2e0;
  xml_output local_2a8;
  xml_output local_270;
  undefined1 local_238 [16];
  Data *local_228;
  undefined1 auStack_220 [16];
  undefined1 auStack_210 [16];
  undefined1 local_200 [16];
  Data *pDStack_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  Data *local_1b8;
  undefined1 auStack_1b0 [16];
  undefined1 auStack_1a0 [24];
  xml_output local_188;
  undefined1 local_150 [16];
  Data *pDStack_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  xml_output local_118;
  xml_output local_e0;
  xml_output local_a8;
  undefined1 local_70 [48];
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar13.m_data = (storage_type *)0x4;
  QVar13.m_size = (qsizetype)local_70;
  QString::fromUtf8(QVar13);
  local_70._24_8_ = local_70._16_8_;
  pQVar4 = (QArrayData *)CONCAT44(local_70._4_4_,local_70._0_4_);
  local_70._0_4_ = tTag;
  local_70._16_8_ = local_70._8_8_;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_70._32_16_ = (undefined1  [16])0x0;
  local_40 = 0;
  local_70._8_8_ = pQVar4;
  pXVar6 = XmlOutput::operator<<
                     ((XmlOutput *)CONCAT44(in_register_00000034,__fd),(xml_output *)local_70);
  attrTagX(&local_a8,"AdditionalIncludeDirectories",(QStringList *)((long)__buf + 8),";");
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_a8);
  attrTagX(&local_e0,"AdditionalOptions",(QStringList *)((long)__buf + 0x20)," ");
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_e0);
  attrTagT(&local_118,"ApplicationConfigurationMode",*(triState *)((long)__buf + 0x194));
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_118);
  if (*(long *)((long)__buf + 0x1c0) == 0) {
    local_150._0_4_ = tNothing;
    stack0xfffffffffffffeb8 = (undefined1  [16])0x0;
    local_138 = (undefined1  [16])0x0;
    local_128 = (undefined1  [16])0x0;
  }
  else {
    QVar14.m_data = (storage_type *)0xe;
    QVar14.m_size = (qsizetype)local_150;
    QString::fromUtf8(QVar14);
    pQVar8 = (QArrayData *)CONCAT44(local_150._4_4_,local_150._0_4_);
    local_138._0_8_ = pDStack_140;
    local_150._0_4_ = tTagValue;
    pDStack_140 = (Data *)local_150._8_8_;
    local_150._8_8_ = pQVar8;
    if (pQVar8 != (QArrayData *)0x0) {
      LOCK();
      (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_138._8_8_ = *(undefined8 *)((long)__buf + 0x1b0);
    local_128 = *(undefined1 (*) [16])((long)__buf + 0x1b8);
    if ((int *)local_138._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_138._8_8_ = *(int *)local_138._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar8 != (QArrayData *)0x0) {
      LOCK();
      (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar8,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_150);
  attrTagX(&local_188,"CPreprocessOptions",(QStringList *)((long)__buf + 0x38)," ");
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_188);
  iVar1 = *(int *)((long)__buf + 0x50);
  if (iVar1 == 2) {
    psVar7 = (storage_type *)0x5;
LAB_001fbbe3:
    QVar15.m_data = psVar7;
    QVar15.m_size = (qsizetype)local_1c8;
    QString::fromUtf8(QVar15);
    pQVar8 = (QArrayData *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_);
    auStack_1a0._8_8_ = local_1b8;
    auStack_1a0._0_8_ = local_1c8._8_8_;
  }
  else {
    if (iVar1 == 1) {
      psVar7 = (storage_type *)0x6;
      goto LAB_001fbbe3;
    }
    if (iVar1 == 0) {
      psVar7 = &DAT_00000008;
      goto LAB_001fbbe3;
    }
    pQVar8 = (QArrayData *)0x0;
    auStack_1a0._0_8_ = (Data *)0x0;
    auStack_1a0._8_8_ = (char16_t *)0x0;
  }
  if ((char16_t *)auStack_1a0._8_8_ == (char16_t *)0x0) {
    local_1c8._0_4_ = tNothing;
    stack0xfffffffffffffe40 = (undefined1  [16])0x0;
    auStack_1b0 = (undefined1  [16])0x0;
    auStack_1a0._0_16_ = (undefined1  [16])0x0;
  }
  else {
    QVar16.m_data = (storage_type *)0xf;
    QVar16.m_size = (qsizetype)local_1c8;
    QString::fromUtf8(QVar16);
    pQVar9 = (QArrayData *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_);
    auStack_1b0._0_8_ = local_1b8;
    local_1c8._0_4_ = tTagValue;
    local_1b8 = (Data *)local_1c8._8_8_;
    local_1c8._8_8_ = pQVar9;
    if (pQVar9 != (QArrayData *)0x0) {
      LOCK();
      (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_1b0._8_8_ = pQVar8;
    if (pQVar8 != (QArrayData *)0x0) {
      LOCK();
      (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar9 != (QArrayData *)0x0) {
      LOCK();
      (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar9->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar9,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_1c8);
  if (*(long *)((long)__buf + 0x68) == 0) {
    local_200._0_4_ = tNothing;
    stack0xfffffffffffffe08 = (undefined1  [16])0x0;
    local_1e8 = (undefined1  [16])0x0;
    local_1d8 = (undefined1  [16])0x0;
  }
  else {
    QVar17.m_data = (storage_type *)0xf;
    QVar17.m_size = (qsizetype)local_200;
    QString::fromUtf8(QVar17);
    pQVar9 = (QArrayData *)CONCAT44(local_200._4_4_,local_200._0_4_);
    local_1e8._0_8_ = pDStack_1f0;
    local_200._0_4_ = tTagValue;
    pDStack_1f0 = (Data *)local_200._8_8_;
    local_200._8_8_ = pQVar9;
    if (pQVar9 != (QArrayData *)0x0) {
      LOCK();
      (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1e8._8_8_ = *(undefined8 *)((long)__buf + 0x58);
    local_1d8 = *(undefined1 (*) [16])((long)__buf + 0x60);
    if ((int *)local_1e8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_1e8._8_8_ = *(int *)local_1e8._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar9 != (QArrayData *)0x0) {
      LOCK();
      (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar9->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar9,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_200);
  if (*(int *)((long)__buf + 0x70) == 2) {
    psVar7 = (storage_type *)0x3;
LAB_001fbdcb:
    QVar18.m_data = psVar7;
    QVar18.m_size = (qsizetype)local_238;
    QString::fromUtf8(QVar18);
    pQVar9 = (QArrayData *)CONCAT44(local_238._4_4_,local_238._0_4_);
    auStack_210._8_8_ = local_228;
    auStack_210._0_8_ = local_238._8_8_;
  }
  else {
    if (*(int *)((long)__buf + 0x70) == 1) {
      psVar7 = (storage_type *)0x4;
      goto LAB_001fbdcb;
    }
    pQVar9 = (QArrayData *)0x0;
    auStack_210._0_8_ = (Data *)0x0;
    auStack_210._8_8_ = (char16_t *)0x0;
  }
  if ((char16_t *)auStack_210._8_8_ == (char16_t *)0x0) {
    local_238._0_4_ = tNothing;
    stack0xfffffffffffffdd0 = (undefined1  [16])0x0;
    auStack_220 = (undefined1  [16])0x0;
    auStack_210 = (undefined1  [16])0x0;
  }
  else {
    QVar19.m_data = (storage_type *)0x11;
    QVar19.m_size = (qsizetype)local_238;
    QString::fromUtf8(QVar19);
    pQVar10 = (QArrayData *)CONCAT44(local_238._4_4_,local_238._0_4_);
    auStack_220._0_8_ = local_228;
    local_238._0_4_ = tTagValue;
    local_228 = (Data *)local_238._8_8_;
    local_238._8_8_ = pQVar10;
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_220._8_8_ = pQVar9;
    if (pQVar9 != (QArrayData *)0x0) {
      LOCK();
      (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar10,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_238);
  attrTagT(&local_270,"ErrorCheckAllocations",*(triState *)((long)__buf + 0x74));
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_270);
  attrTagT(&local_2a8,"ErrorCheckBounds",*(triState *)((long)__buf + 0x78));
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_2a8);
  attrTagT(&local_2e0,"ErrorCheckEnumRange",*(triState *)((long)__buf + 0x7c));
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_2e0);
  attrTagT(&local_318,"ErrorCheckRefPointers",*(triState *)((long)__buf + 0x80));
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_318);
  attrTagT(&local_350,"ErrorCheckStubData",*(triState *)((long)__buf + 0x84));
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_350);
  if (*(long *)((long)__buf + 0x1a8) == 0) {
    local_388._0_4_ = tNothing;
    stack0xfffffffffffffc80 = (undefined1  [16])0x0;
    local_370 = (undefined1  [16])0x0;
    local_360 = (undefined1  [16])0x0;
  }
  else {
    QVar20.m_data = (storage_type *)0x13;
    QVar20.m_size = (qsizetype)local_388;
    QString::fromUtf8(QVar20);
    pQVar10 = (QArrayData *)CONCAT44(local_388._4_4_,local_388._0_4_);
    local_370._0_8_ = pDStack_378;
    local_388._0_4_ = tTagValue;
    pDStack_378 = (Data *)local_388._8_8_;
    local_388._8_8_ = pQVar10;
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_370._8_8_ = *(undefined8 *)((long)__buf + 0x198);
    local_360 = *(undefined1 (*) [16])((long)__buf + 0x1a0);
    if ((int *)local_370._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_370._8_8_ = *(int *)local_370._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar10,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_388);
  if (*(long *)((long)__buf + 0x1f8) == 0) {
    local_3c0._0_4_ = tNothing;
    stack0xfffffffffffffc48 = (undefined1  [16])0x0;
    local_3a8 = (undefined1  [16])0x0;
    local_398 = (undefined1  [16])0x0;
  }
  else {
    QVar21.m_data = (storage_type *)0x13;
    QVar21.m_size = (qsizetype)local_3c0;
    QString::fromUtf8(QVar21);
    pQVar10 = (QArrayData *)CONCAT44(local_3c0._4_4_,local_3c0._0_4_);
    local_3a8._0_8_ = pDStack_3b0;
    local_3c0._0_4_ = tTagValue;
    pDStack_3b0 = (Data *)local_3c0._8_8_;
    local_3c0._8_8_ = pQVar10;
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_3a8._8_8_ = *(undefined8 *)((long)__buf + 0x1e8);
    local_398 = *(undefined1 (*) [16])((long)__buf + 0x1f0);
    if ((int *)local_3a8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_3a8._8_8_ = *(int *)local_3a8._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar10,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_3c0);
  attrTagT(&local_3f8,"GenerateStublessProxies",*(triState *)((long)__buf + 0xa0));
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_3f8);
  attrTagT(&local_430,"GenerateTypeLibrary",*(triState *)((long)__buf + 0xa4));
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_430);
  if (*(long *)((long)__buf + 0xb8) == 0) {
    local_468._0_4_ = tNothing;
    stack0xfffffffffffffba0 = (undefined1  [16])0x0;
    local_450 = (undefined1  [16])0x0;
    local_440 = (undefined1  [16])0x0;
  }
  else {
    QVar22.m_data = (storage_type *)0xe;
    QVar22.m_size = (qsizetype)local_468;
    QString::fromUtf8(QVar22);
    pQVar10 = (QArrayData *)CONCAT44(local_468._4_4_,local_468._0_4_);
    local_450._0_8_ = pDStack_458;
    local_468._0_4_ = tTagValue;
    pDStack_458 = (Data *)local_468._8_8_;
    local_468._8_8_ = pQVar10;
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_450._8_8_ = *(undefined8 *)((long)__buf + 0xa8);
    local_440 = *(undefined1 (*) [16])((long)__buf + 0xb0);
    if ((int *)local_450._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_450._8_8_ = *(int *)local_450._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar10,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_468);
  attrTagT(&local_4a0,"IgnoreStandardIncludePath",*(triState *)((long)__buf + 0xc0));
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_4a0);
  if (*(long *)((long)__buf + 0xd8) == 0) {
    local_4d8._0_4_ = tNothing;
    stack0xfffffffffffffb30 = (undefined1  [16])0x0;
    local_4c0 = (undefined1  [16])0x0;
    local_4b0 = (undefined1  [16])0x0;
  }
  else {
    QVar23.m_data = (storage_type *)0x1b;
    QVar23.m_size = (qsizetype)local_4d8;
    QString::fromUtf8(QVar23);
    pQVar10 = (QArrayData *)CONCAT44(local_4d8._4_4_,local_4d8._0_4_);
    local_4c0._0_8_ = pDStack_4c8;
    local_4d8._0_4_ = tTagValue;
    pDStack_4c8 = (Data *)local_4d8._8_8_;
    local_4d8._8_8_ = pQVar10;
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_4c0._8_8_ = *(undefined8 *)((long)__buf + 200);
    local_4b0 = *(undefined1 (*) [16])((long)__buf + 0xd0);
    if ((int *)local_4c0._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_4c0._8_8_ = *(int *)local_4c0._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar10,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_4d8);
  lVar2 = *(long *)((long)__buf + 0x218);
  if (lVar2 == -1) {
    local_510._0_4_ = tNothing;
    stack0xfffffffffffffaf8 = (undefined1  [16])0x0;
    local_4f8 = (undefined1  [16])0x0;
    local_4e8 = (undefined1  [16])0x0;
  }
  else {
    QVar24.m_data = &DAT_00000008;
    QVar24.m_size = (qsizetype)local_510;
    QString::fromUtf8(QVar24);
    pQVar10 = (QArrayData *)CONCAT44(local_510._4_4_,local_510._0_4_);
    pDVar5 = pDStack_500;
    QString::number((longlong)&local_548,(int)lVar2);
    local_510._0_4_ = tTagValue;
    pDStack_500 = (Data *)local_510._8_8_;
    local_510._8_8_ = pQVar10;
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_4f8._8_8_ = local_548._0_8_;
    local_4f8._0_8_ = pDVar5;
    local_4e8._8_8_ = local_548.xo_text.d.ptr;
    local_4e8._0_8_ = local_548.xo_text.d.d;
    if ((QArrayData *)local_548._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_548._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_548._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QBasicAtomicInt *)local_548._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_548._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_548._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_548._0_8_,2,0x10);
      }
    }
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar10,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_510);
  attrTagT(&local_548,"MkTypLibCompatible",*(triState *)((long)__buf + 0xe0));
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_548);
  if (*(long *)((long)__buf + 0xf8) == 0) {
    local_580._0_4_ = tNothing;
    stack0xfffffffffffffa88 = (undefined1  [16])0x0;
    local_568 = (undefined1  [16])0x0;
    local_558 = (undefined1  [16])0x0;
  }
  else {
    QVar25.m_data = (storage_type *)0xf;
    QVar25.m_size = (qsizetype)local_580;
    QString::fromUtf8(QVar25);
    pQVar10 = (QArrayData *)CONCAT44(local_580._4_4_,local_580._0_4_);
    local_568._0_8_ = pDStack_570;
    local_580._0_4_ = tTagValue;
    pDStack_570 = (Data *)local_580._8_8_;
    local_580._8_8_ = pQVar10;
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_568._8_8_ = *(undefined8 *)((long)__buf + 0xe8);
    local_558 = *(undefined1 (*) [16])((long)__buf + 0xf0);
    if ((int *)local_568._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_568._8_8_ = *(int *)local_568._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar10,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_580);
  attrTagX(&local_5b8,"PreprocessorDefinitions",(QStringList *)((long)__buf + 0x100),";");
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_5b8);
  if (*(long *)((long)__buf + 0x128) == 0) {
    local_5f0._0_4_ = tNothing;
    stack0xfffffffffffffa18 = (undefined1  [16])0x0;
    local_5d8 = (undefined1  [16])0x0;
    local_5c8 = (undefined1  [16])0x0;
  }
  else {
    QVar26.m_data = (storage_type *)0xd;
    QVar26.m_size = (qsizetype)local_5f0;
    QString::fromUtf8(QVar26);
    pQVar10 = (QArrayData *)CONCAT44(local_5f0._4_4_,local_5f0._0_4_);
    local_5d8._0_8_ = pDStack_5e0;
    local_5f0._0_4_ = tTagValue;
    pDStack_5e0 = (Data *)local_5f0._8_8_;
    local_5f0._8_8_ = pQVar10;
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_5d8._8_8_ = *(undefined8 *)((long)__buf + 0x118);
    local_5c8 = *(undefined1 (*) [16])((long)__buf + 0x120);
    if ((int *)local_5d8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_5d8._8_8_ = *(int *)local_5d8._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar10,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_5f0);
  if (*(long *)((long)__buf + 0x140) == 0) {
    local_628._0_4_ = tNothing;
    stack0xfffffffffffff9e0 = (undefined1  [16])0x0;
    local_610 = (undefined1  [16])0x0;
    local_600 = (undefined1  [16])0x0;
  }
  else {
    QVar27.m_data = (storage_type *)0x17;
    QVar27.m_size = (qsizetype)local_628;
    QString::fromUtf8(QVar27);
    pQVar10 = (QArrayData *)CONCAT44(local_628._4_4_,local_628._0_4_);
    local_610._0_8_ = pDStack_618;
    local_628._0_4_ = tTagValue;
    pDStack_618 = (Data *)local_628._8_8_;
    local_628._8_8_ = pQVar10;
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_610._8_8_ = *(undefined8 *)((long)__buf + 0x130);
    local_600 = *(undefined1 (*) [16])((long)__buf + 0x138);
    if ((int *)local_610._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_610._8_8_ = *(int *)local_610._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar10,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_628);
  if (*(long *)((long)__buf + 0x210) == 0) {
    local_660._0_4_ = tNothing;
    stack0xfffffffffffff9a8 = (undefined1  [16])0x0;
    local_648 = (undefined1  [16])0x0;
    local_638 = (undefined1  [16])0x0;
  }
  else {
    QVar28.m_data = (storage_type *)0xe;
    QVar28.m_size = (qsizetype)local_660;
    QString::fromUtf8(QVar28);
    pQVar10 = (QArrayData *)CONCAT44(local_660._4_4_,local_660._0_4_);
    local_648._0_8_ = pDStack_650;
    local_660._0_4_ = tTagValue;
    pDStack_650 = (Data *)local_660._8_8_;
    local_660._8_8_ = pQVar10;
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_648._8_8_ = *(undefined8 *)((long)__buf + 0x200);
    local_638 = *(undefined1 (*) [16])((long)__buf + 0x208);
    if ((int *)local_648._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_648._8_8_ = *(int *)local_648._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar10,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_660);
  switch(*(undefined4 *)((long)__buf + 0x148)) {
  case 1:
    break;
  case 2:
    break;
  case 3:
    break;
  case 4:
    break;
  case 5:
    psVar7 = (storage_type *)0x2;
    goto LAB_001fc8e3;
  default:
    pQVar10 = (QArrayData *)0x0;
    auStack_670._8_8_ = (char16_t *)0x0;
    auStack_670._0_8_ = (Data *)0x0;
    goto LAB_001fc8f4;
  }
  psVar7 = (storage_type *)0x1;
LAB_001fc8e3:
  QVar29.m_data = psVar7;
  QVar29.m_size = (qsizetype)local_698;
  QString::fromUtf8(QVar29);
  pQVar10 = (QArrayData *)CONCAT44(local_698._4_4_,local_698._0_4_);
  auStack_670._8_8_ = local_688;
  auStack_670._0_8_ = local_698._8_8_;
LAB_001fc8f4:
  if ((char16_t *)auStack_670._8_8_ == (char16_t *)0x0) {
    local_698._0_4_ = tNothing;
    stack0xfffffffffffff970 = (undefined1  [16])0x0;
    auStack_680 = (undefined1  [16])0x0;
    auStack_670 = (undefined1  [16])0x0;
  }
  else {
    QVar30.m_data = (storage_type *)0x15;
    QVar30.m_size = (qsizetype)local_698;
    QString::fromUtf8(QVar30);
    pQVar11 = (QArrayData *)CONCAT44(local_698._4_4_,local_698._0_4_);
    auStack_680._0_8_ = local_688;
    local_698._0_4_ = tTagValue;
    local_688 = (Data *)local_698._8_8_;
    local_698._8_8_ = pQVar11;
    if (pQVar11 != (QArrayData *)0x0) {
      LOCK();
      (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_680._8_8_ = pQVar10;
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar11 != (QArrayData *)0x0) {
      LOCK();
      (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar11,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_698);
  attrTagT(&local_6d0,"SuppressCompilerWarnings",*(triState *)((long)__buf + 0x1e4));
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_6d0);
  attrTagT(&local_708,"SuppressStartupBanner",*(triState *)((long)__buf + 0x14c));
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_708);
  if (*(int *)((long)__buf + 0x150) == 2) {
    psVar7 = (storage_type *)0x3;
LAB_001fca4d:
    QVar31.m_data = psVar7;
    QVar31.m_size = (qsizetype)local_748;
    QString::fromUtf8(QVar31);
    pQVar11 = (QArrayData *)CONCAT44(local_748._4_4_,local_748._0_4_);
    auStack_720._8_8_ = local_738;
    auStack_720._0_8_ = local_748._8_8_;
  }
  else {
    if (*(int *)((long)__buf + 0x150) == 1) {
      psVar7 = (storage_type *)0x5;
      goto LAB_001fca4d;
    }
    pQVar11 = (QArrayData *)0x0;
    auStack_720._0_8_ = (Data *)0x0;
    auStack_720._8_8_ = (char16_t *)0x0;
  }
  if ((char16_t *)auStack_720._8_8_ == (char16_t *)0x0) {
    local_748._0_4_ = tNothing;
    stack0xfffffffffffff8c0 = (undefined1  [16])0x0;
    auStack_730 = (undefined1  [16])0x0;
    auStack_720._0_16_ = (undefined1  [16])0x0;
  }
  else {
    QVar32.m_data = (storage_type *)0x11;
    QVar32.m_size = (qsizetype)local_748;
    QString::fromUtf8(QVar32);
    pQVar12 = (QArrayData *)CONCAT44(local_748._4_4_,local_748._0_4_);
    auStack_730._0_8_ = local_738;
    local_748._0_4_ = tTagValue;
    local_738 = (Data *)local_748._8_8_;
    local_748._8_8_ = pQVar12;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_730._8_8_ = pQVar11;
    if (pQVar11 != (QArrayData *)0x0) {
      LOCK();
      (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar12,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_748);
  if (*(long *)((long)__buf + 0x1d8) == 0) {
    local_780._0_4_ = tNothing;
    stack0xfffffffffffff888 = (undefined1  [16])0x0;
    local_768 = (undefined1  [16])0x0;
    local_758 = (undefined1  [16])0x0;
  }
  else {
    QVar33.m_data = (storage_type *)0xd;
    QVar33.m_size = (qsizetype)local_780;
    QString::fromUtf8(QVar33);
    pQVar12 = (QArrayData *)CONCAT44(local_780._4_4_,local_780._0_4_);
    local_768._0_8_ = pDStack_770;
    local_780._0_4_ = tTagValue;
    pDStack_770 = (Data *)local_780._8_8_;
    local_780._8_8_ = pQVar12;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_768._8_8_ = *(undefined8 *)((long)__buf + 0x1c8);
    local_758 = *(undefined1 (*) [16])((long)__buf + 0x1d0);
    if ((int *)local_768._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_768._8_8_ = *(int *)local_768._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar12,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_780);
  if (*(long *)((long)__buf + 0x168) == 0) {
    local_7b8._0_4_ = tNothing;
    stack0xfffffffffffff850 = (undefined1  [16])0x0;
    local_7a0 = (undefined1  [16])0x0;
    local_790 = (undefined1  [16])0x0;
  }
  else {
    QVar34.m_data = (storage_type *)0xf;
    QVar34.m_size = (qsizetype)local_7b8;
    QString::fromUtf8(QVar34);
    pQVar12 = (QArrayData *)CONCAT44(local_7b8._4_4_,local_7b8._0_4_);
    local_7a0._0_8_ = pDStack_7a8;
    local_7b8._0_4_ = tTagValue;
    pDStack_7a8 = (Data *)local_7b8._8_8_;
    local_7b8._8_8_ = pQVar12;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_7a0._8_8_ = *(undefined8 *)((long)__buf + 0x158);
    local_790 = *(undefined1 (*) [16])((long)__buf + 0x160);
    if ((int *)local_7a0._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_7a0._8_8_ = *(int *)local_7a0._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar12,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_7b8);
  attrTagX(&local_7f0,"UndefinePreprocessorDefinitions",(QStringList *)((long)__buf + 0x170),";");
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_7f0);
  attrTagT(&local_828,"ValidateAllParameters",*(triState *)((long)__buf + 0x1e0));
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_828);
  attrTagT(&local_860,"WarnAsError",*(triState *)((long)__buf + 0x18c));
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_860);
  switch(*(undefined4 *)((long)__buf + 400)) {
  case 0:
    break;
  case 1:
    break;
  case 2:
    break;
  case 3:
    break;
  case 4:
    break;
  default:
    pQVar12 = (QArrayData *)0x0;
    auStack_870._8_8_ = (char16_t *)0x0;
    auStack_870._0_8_ = (Data *)0x0;
    goto LAB_001fcdd9;
  }
  QVar35.m_data = (storage_type *)0x1;
  QVar35.m_size = (qsizetype)local_898;
  QString::fromUtf8(QVar35);
  pQVar12 = (QArrayData *)CONCAT44(local_898._4_4_,local_898._0_4_);
  auStack_870._8_8_ = local_888;
  auStack_870._0_8_ = local_898._8_8_;
LAB_001fcdd9:
  if ((char16_t *)auStack_870._8_8_ == (char16_t *)0x0) {
    local_898._0_4_ = tNothing;
    stack0xfffffffffffff770 = (undefined1  [16])0x0;
    auStack_880 = (undefined1  [16])0x0;
    auStack_870 = (undefined1  [16])0x0;
  }
  else {
    QVar36.m_data = &DAT_0000000c;
    QVar36.m_size = (qsizetype)local_898;
    QString::fromUtf8(QVar36);
    pQVar3 = (QArrayData *)CONCAT44(local_898._4_4_,local_898._0_4_);
    auStack_880._0_8_ = local_888;
    local_898._0_4_ = tTagValue;
    local_888 = (Data *)local_898._8_8_;
    local_898._8_8_ = pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_880._8_8_ = pQVar12;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,(xml_output *)local_898);
  QVar37.m_data = (storage_type *)0x4;
  QVar37.m_size = (qsizetype)&local_8d0;
  QString::fromUtf8(QVar37);
  local_8d0.xo_text.d.size = (qsizetype)local_8d0.xo_text.d.ptr;
  pQVar3 = (QArrayData *)CONCAT44(local_8d0._4_4_,local_8d0.xo_type);
  local_8d0.xo_type = tCloseTag;
  local_8d0.xo_text.d.ptr = (char16_t *)local_8d0.xo_text.d.d;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_8d0.xo_value.d.d = (Data *)0x0;
  local_8d0.xo_value.d.ptr = (char16_t *)0x0;
  local_8d0.xo_value.d.size = 0;
  local_8d0.xo_text.d.d = (Data *)pQVar3;
  XmlOutput::operator<<(pXVar6,&local_8d0);
  if (&(local_8d0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_8d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_8d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_8d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_8d0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_8d0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_8d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_8d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_8d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_8d0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  if ((QArrayData *)auStack_880._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_880._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_880._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_880._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_880._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_898._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_898._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_898._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_898._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_898._8_8_,2,0x10);
    }
  }
  if (pQVar12 != (QArrayData *)0x0) {
    LOCK();
    (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar12,2,0x10);
    }
  }
  if (&(local_860.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_860.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_860.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_860.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_860.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_860.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_860.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_860.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_860.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_860.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_828.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_828.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_828.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_828.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_828.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_828.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_828.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_828.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_828.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_828.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_7f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_7f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_7f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_7f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_7f0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_7f0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_7f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_7f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_7f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_7f0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_7a0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_7a0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_7a0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_7a0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_7a0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_7b8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_7b8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_7b8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_7b8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_7b8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_768._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_768._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_768._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_768._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_768._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_780._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_780._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_780._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_780._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_780._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_730._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_730._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_730._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_730._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_730._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_748._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_748._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_748._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_748._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_748._8_8_,2,0x10);
    }
  }
  if (pQVar11 != (QArrayData *)0x0) {
    LOCK();
    (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar11,2,0x10);
    }
  }
  if (&(local_708.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_708.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_708.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_708.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_708.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_708.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_708.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_708.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_708.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_708.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_6d0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_6d0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_6d0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_6d0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)auStack_680._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_680._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_680._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_680._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_680._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_698._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_698._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_698._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_698._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_698._8_8_,2,0x10);
    }
  }
  if (pQVar10 != (QArrayData *)0x0) {
    LOCK();
    (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar10,2,0x10);
    }
  }
  if ((QArrayData *)local_648._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_648._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_648._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_648._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_648._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_660._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_660._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_660._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_660._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_660._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_610._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_610._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_610._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_610._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_610._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_628._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_628._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_628._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_628._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_628._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_5d8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_5d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_5d8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_5d8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_5d8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_5f0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_5f0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_5f0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_5f0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_5f0._8_8_,2,0x10);
    }
  }
  if (&(local_5b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_5b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_5b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_5b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_5b8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_5b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_5b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_5b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_5b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_5b8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_568._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_568._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_568._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_568._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_568._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_580._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_580._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_580._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_580._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_580._8_8_,2,0x10);
    }
  }
  if (&(local_548.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_548.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_548.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_548.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_548.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_548.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_548.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_548.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_548.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_548.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_4f8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_4f8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_4f8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_4f8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_4f8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_510._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_510._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_510._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_510._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_510._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_4c0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_4c0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_4c0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_4c0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_4c0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_4d8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_4d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_4d8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_4d8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_4d8._8_8_,2,0x10);
    }
  }
  if (&(local_4a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_4a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_4a0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_4a0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_4a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_4a0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_450._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_450._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_450._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_450._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_450._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_468._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_468._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_468._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_468._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_468._8_8_,2,0x10);
    }
  }
  if (&(local_430.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_430.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_430.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_430.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_430.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_430.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_430.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_430.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_430.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_430.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_3f8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_3f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_3f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_3f8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_3f8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_3f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_3f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_3f8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_3a8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_3a8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_3a8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_3a8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_3a8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_3c0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_3c0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_3c0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_3c0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_3c0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_370._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_370._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_370._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_370._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_370._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_388._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_388._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_388._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_388._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_388._8_8_,2,0x10);
    }
  }
  if (&(local_350.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_350.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_350.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_350.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_350.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_350.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_350.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_350.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_350.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_350.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_318.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_318.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_318.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_318.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_318.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_318.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_318.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_318.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_318.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_318.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2e0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2e0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2e0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2e0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2a8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2a8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2a8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_270.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_270.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_270.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_270.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_270.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_270.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_270.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_270.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_270.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_270.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)auStack_220._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_220._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_220._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_220._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_220._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_238._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_238._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_238._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_238._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_238._8_8_,2,0x10);
    }
  }
  if (pQVar9 != (QArrayData *)0x0) {
    LOCK();
    (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar9->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar9,2,0x10);
    }
  }
  if ((QArrayData *)local_1e8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_1e8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_1e8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_1e8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_1e8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_200._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_200._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_200._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_200._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_200._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_1b0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_1b0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_1b0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_1b0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_1b0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_1c8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_1c8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_1c8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_1c8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_1c8._8_8_,2,0x10);
    }
  }
  if (pQVar8 != (QArrayData *)0x0) {
    LOCK();
    (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar8,2,0x10);
    }
  }
  if (&(local_188.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_188.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_188.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_188.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_138._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_138._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_138._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_138._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_138._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_150._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_150._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_150._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_150._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_150._8_8_,2,0x10);
    }
  }
  if (&(local_118.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_118.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_e0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_a8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_70._32_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_70._32_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_70._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_70._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_70._32_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_70._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_70._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_70._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_70._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_70._8_8_,2,0x10);
    }
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCMIDLTool &tool)
{
    xml
        << tag(_Midl)
            << attrTagX(_AdditionalIncludeDirectories, tool.AdditionalIncludeDirectories, ";")
            << attrTagX(_AdditionalOptions, tool.AdditionalOptions, " ")
            << attrTagT(_ApplicationConfigurationMode, tool.ApplicationConfigurationMode)
            << attrTagS(_ClientStubFile, tool.ClientStubFile)
            << attrTagX(_CPreprocessOptions, tool.CPreprocessOptions, " ")
            << attrTagS(_DefaultCharType, toString(tool.DefaultCharType))
            << attrTagS(_DLLDataFileName, tool.DLLDataFileName)
            << attrTagS(_EnableErrorChecks, toString(tool.EnableErrorChecks))
            << attrTagT(_ErrorCheckAllocations, tool.ErrorCheckAllocations)
            << attrTagT(_ErrorCheckBounds, tool.ErrorCheckBounds)
            << attrTagT(_ErrorCheckEnumRange, tool.ErrorCheckEnumRange)
            << attrTagT(_ErrorCheckRefPointers, tool.ErrorCheckRefPointers)
            << attrTagT(_ErrorCheckStubData, tool.ErrorCheckStubData)
            << attrTagS(_GenerateClientFiles, tool.GenerateClientFiles)
            << attrTagS(_GenerateServerFiles, tool.GenerateServerFiles)
            << attrTagT(_GenerateStublessProxies, tool.GenerateStublessProxies)
            << attrTagT(_GenerateTypeLibrary, tool.GenerateTypeLibrary)
            << attrTagS(_HeaderFileName, tool.HeaderFileName)
            << attrTagT(_IgnoreStandardIncludePath, tool.IgnoreStandardIncludePath)
            << attrTagS(_InterfaceIdentifierFileName, tool.InterfaceIdentifierFileName)
            << attrTagL(_LocaleID, tool.LocaleID, /*ifNot*/ -1)
            << attrTagT(_MkTypLibCompatible, tool.MkTypLibCompatible)
            << attrTagS(_OutputDirectory, tool.OutputDirectory)
            << attrTagX(_PreprocessorDefinitions, tool.PreprocessorDefinitions, ";")
            << attrTagS(_ProxyFileName, tool.ProxyFileName)
            << attrTagS(_RedirectOutputAndErrors, tool.RedirectOutputAndErrors)
            << attrTagS(_ServerStubFile, tool.ServerStubFile)
            << attrTagS(_StructMemberAlignment, toString(tool.StructMemberAlignment))
            << attrTagT(_SuppressCompilerWarnings, tool.SuppressCompilerWarnings)
            << attrTagT(_SuppressStartupBanner, tool.SuppressStartupBanner)
            << attrTagS(_TargetEnvironment, toString(tool.TargetEnvironment))
            << attrTagS(_TypeLibFormat, tool.TypeLibFormat)
            << attrTagS(_TypeLibraryName, tool.TypeLibraryName)
            << attrTagX(_UndefinePreprocessorDefinitions, tool.UndefinePreprocessorDefinitions, ";")
            << attrTagT(_ValidateAllParameters, tool.ValidateAllParameters)
            << attrTagT(_WarnAsError, tool.WarnAsError)
            << attrTagS(_WarningLevel, toString(tool.WarningLevel))
        << closetag(_Midl);
}